

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O2

void ProgramOptions::usage(char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," -hanmeifc -g G -r R <image.png>\n");
  std::operator<<(poVar1,
                  "Options:\n  -h    Show help.\n\nImage processing function selection: \n  -g G  Gaussian blur with kernel size GxG.\n  -m    Histogram.\n  -e    Contrast enhancement (enables histogram).\n  -n    Output contrast enhanced histogram as image (unaffected by -i).\n  -r R  Ripple effect with frequency R.\n\n  -i    Save intermediate images.\n  -f    Run full baseline pipeline.\n\n  -c    Run full pipeline using CUDA.\n  -a    Run full baseline & CUDA pipeline, compare output.\n"
                 );
  std::ostream::flush();
  exit(0);
}

Assistant:

static void usage(char *argv[]) {
    std::cerr << "Usage: " << argv[0] << " -hanmeifc -g G -r R <image.png>\n"
              << "Options:\n"
                 "  -h    Show help.\n"
                 "\n"
                 "Image processing function selection: \n"
                 "  -g G  Gaussian blur with kernel size GxG.\n"
                 "  -m    Histogram.\n"
                 "  -e    Contrast enhancement (enables histogram).\n"
                 "  -n    Output contrast enhanced histogram as image (unaffected by -i).\n"
                 "  -r R  Ripple effect with frequency R.\n"
                 "\n"
                 "  -i    Save intermediate images.\n"
                 "  -f    Run full baseline pipeline.\n"
                 "\n"
                 "  -c    Run full pipeline using CUDA.\n"
                 "  -a    Run full baseline & CUDA pipeline, compare output.\n";

    std::cerr.flush();
    exit(0);
  }